

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

void __thiscall QAction::setShortcutVisibleInContextMenu(QAction *this,bool visible)

{
  ushort uVar1;
  QActionPrivate *this_00;
  char cVar2;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  uVar1 = *(ushort *)&this_00->field_0x188;
  if ((uVar1 & 0x1800) != 0x1800 && ((uVar1 & 0x1800) == 0) != visible) {
    return;
  }
  *(ushort *)&this_00->field_0x188 = uVar1 & 0xe7ff | (ushort)visible << 0xb;
  if (((uVar1 & 0x1800) == 0x1800) &&
     (cVar2 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus),
     (bool)cVar2 == visible)) {
    return;
  }
  QActionPrivate::sendDataChanged(this_00);
  return;
}

Assistant:

void QAction::setShortcutVisibleInContextMenu(bool visible)
{
    Q_D(QAction);
    if (d->shortcutVisibleInContextMenu == -1 || visible != bool(d->shortcutVisibleInContextMenu)) {
        int oldValue = d->shortcutVisibleInContextMenu;
        d->shortcutVisibleInContextMenu = visible;
        // Only send data changed if we really need to.
        if (oldValue != -1
            || visible == !QCoreApplication::testAttribute(Qt::AA_DontShowShortcutsInContextMenus)) {
            d->sendDataChanged();
        }
    }
}